

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

timestamp_t
duckdb::DateTrunc::MinuteOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
          (timestamp_t input)

{
  dtime_t time_00;
  timestamp_t tVar1;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  int32_t hour;
  dtime_t time;
  date_t local_34;
  int32_t local_30;
  int32_t local_2c;
  int32_t local_28;
  int32_t local_24;
  dtime_t local_20;
  
  Timestamp::Convert(input,&local_34,&local_20);
  Time::Convert(local_20,&local_24,&local_28,&local_2c,&local_30);
  time_00 = Time::FromTime(local_24,local_28,0,0);
  tVar1 = Timestamp::FromDatetime(local_34,time_00);
  return (timestamp_t)tVar1.value;
}

Assistant:

static inline TR Operation(TA input) {
			int32_t hour, min, sec, micros;
			date_t date;
			dtime_t time;
			Timestamp::Convert(input, date, time);
			Time::Convert(time, hour, min, sec, micros);
			return Timestamp::FromDatetime(date, Time::FromTime(hour, min, 0, 0));
		}